

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colVector.c
# Opt level: O2

void Col_MVectorSetLength(Col_Word mvector,size_t length)

{
  ulong uVar1;
  uint uVar2;
  
  if (mvector == 0) {
    mvector = 0;
  }
  else {
    if ((mvector & 0xf) == 0) {
      if ((*(byte *)mvector & 2) == 0) goto LAB_0010d326;
      uVar2 = *(byte *)mvector & 0xfffffffe;
    }
    else {
      uVar2 = immediateWordTypes[(uint)mvector & 0x1f];
    }
    if ((uVar2 == 2) && ((*(byte *)(mvector + 2) & 0xc) == 0)) {
      mvector = *(undefined8 *)(mvector + 0x10);
    }
  }
LAB_0010d326:
  if ((*(ulong *)mvector >> 3 & 0xffffffffffffffe0) - 0x10 >> 3 < length) {
    Col_Error(COL_VALUECHECK,ColibriDomain,0x12,length);
    return;
  }
  uVar1 = *(ulong *)(mvector + 8);
  if (uVar1 <= length && length - uVar1 != 0) {
    memset((ulong *)(mvector + (uVar1 + 2) * 8),0,(length - uVar1) * 8);
  }
  *(size_t *)(mvector + 8) = length;
  return;
}

Assistant:

void
Col_MVectorSetLength(
    Col_Word mvector,   /*!< Mutable vector to resize. */
    size_t length)      /*!< New length. Must not exceed capacity set at
                             creation time. */
{
    size_t capacity, oldLength;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_MVECTOR,mvector} */
    TYPECHECK_MVECTOR(mvector) return;

    WORD_UNWRAP(mvector);

    /*! @valuecheck{COL_ERROR_VECTORLENGTH,length < [Col_MVectorCapacity(mvector)](@ref Col_MVectorCapacity).} */
    capacity = VECTOR_MAX_LENGTH(WORD_MVECTOR_SIZE(mvector) * CELL_SIZE);
    VALUECHECK_VECTORLENGTH(length, capacity) return;

    oldLength = WORD_VECTOR_LENGTH(mvector);
    if (length > oldLength) {
        /*
         * Initialize elements to nil.
         */

        memset(WORD_VECTOR_ELEMENTS(mvector) + oldLength, 0, (length
                - oldLength)*sizeof(Col_Word));
    }
    WORD_VECTOR_LENGTH(mvector) = length;
}